

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol,double *array)

{
  long in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  uint j;
  uint i;
  uint local_20;
  uint local_1c;
  
  allocate((DynamicRectMatrix<double> *)CONCAT44(in_ESI,in_EDX),(uint)((ulong)in_RCX >> 0x20),
           (uint)in_RCX);
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 1); local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < *(uint *)((long)in_RDI + 0xc); local_20 = local_20 + 1) {
      *(undefined8 *)(*(long *)(*in_RDI + (ulong)local_1c * 8) + (ulong)local_20 * 8) =
           *(undefined8 *)(in_RCX + (ulong)(local_1c * *(int *)((long)in_RDI + 0xc) + local_20) * 8)
      ;
    }
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol, Real* array) {
      allocate(nrow, ncol);
      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = array[i * ncol_ + j];
    }